

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skolem.cpp
# Opt level: O0

uint Shell::Skolem::addSkolemFunction
               (uint arity,uint taArity,TermList *domainSorts,TermList rangeSort,char *suffix)

{
  uint uVar1;
  TermList resultSort;
  Symbol *in_RCX;
  Signature *in_R8;
  OperatorType *ot;
  Symbol *fnSym;
  uint fun;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  Signature *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  uint arity_00;
  char *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffdc;
  
  arity_00 = (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar1 = Kernel::Signature::addSkolemFunction
                    (in_R8,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,
                     SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
  resultSort._content =
       (uint64_t)Kernel::Signature::getFunction(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc)
  ;
  Kernel::Signature::Symbol::markSkipCongruence((Symbol *)resultSort._content);
  Kernel::OperatorType::getFunctionType
            (arity_00,(TermList *)in_RCX,resultSort,in_stack_ffffffffffffffbc);
  Kernel::Signature::Symbol::setType
            (in_RCX,(OperatorType *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  return uVar1;
}

Assistant:

unsigned Skolem::addSkolemFunction(unsigned arity, unsigned taArity, TermList* domainSorts,
    TermList rangeSort, const char* suffix)
{
  //ASS(arity==0 || domainSorts!=0);

  unsigned fun = env.signature->addSkolemFunction(arity, suffix);
  Signature::Symbol* fnSym = env.signature->getFunction(fun);
  fnSym->markSkipCongruence();
  OperatorType* ot = OperatorType::getFunctionType(arity - taArity, domainSorts, rangeSort, taArity);
  fnSym->setType(ot);
  return fun;
}